

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error ps_parser_load_field_table
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  undefined4 uVar3;
  byte bVar4;
  FT_Error FVar5;
  T1_Token tokens;
  uint uVar6;
  int iVar7;
  undefined1 local_388 [8];
  T1_TokenRec elements [32];
  T1_FieldRec fieldrec;
  
  elements[0x1f]._16_8_ = field->ident;
  uVar3 = field->location;
  fieldrec._8_8_ = field->reader;
  fieldrec.reader = *(T1_Field_ParseFunc *)&field->offset;
  fieldrec._24_8_ = *(undefined8 *)&field->array_max;
  fieldrec.array_max = field->dict;
  fieldrec.count_offset = *(FT_UInt *)&field->field_0x2c;
  fieldrec.ident = (char *)CONCAT44(2,uVar3);
  if ((field->type == T1_FIELD_TYPE_FIXED_ARRAY) || (field->type == T1_FIELD_TYPE_BBOX)) {
    fieldrec.ident = (char *)CONCAT44(3,uVar3);
  }
  tokens = (T1_Token)local_388;
  ps_parser_to_token_array(parser,tokens,0x20,(FT_Int *)&fieldrec.field_0x2c);
  if ((int)fieldrec._44_4_ < 0) {
    FVar5 = 0xa2;
  }
  else {
    uVar6 = field->array_max;
    if ((uint)fieldrec._44_4_ < field->array_max) {
      uVar6 = fieldrec._44_4_;
    }
    pFVar1 = parser->cursor;
    pFVar2 = parser->limit;
    if ((field->type != T1_FIELD_TYPE_BBOX) && ((ulong)field->count_offset != 0)) {
      *(char *)((long)*objects + (ulong)field->count_offset) = (char)uVar6;
    }
    bVar4 = fieldrec.reader._4_1_;
    iVar7 = (int)fieldrec.reader;
    for (; iVar7 = iVar7 + (uint)bVar4, 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      parser->cursor = tokens->start;
      parser->limit = tokens->limit;
      FVar5 = ps_parser_load_field(parser,(T1_Field)&elements[0x1f].type,objects,max_objects,pflags)
      ;
      if (FVar5 != 0) goto LAB_00205038;
      fieldrec.reader = (T1_Field_ParseFunc)CONCAT44(fieldrec.reader._4_4_,iVar7);
      tokens = tokens + 1;
    }
    FVar5 = 0;
LAB_00205038:
    parser->cursor = pFVar1;
    parser->limit = pFVar2;
  }
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field_table( PS_Parser       parser,
                              const T1_Field  field,
                              void**          objects,
                              FT_UInt         max_objects,
                              FT_ULong*       pflags )
  {
    T1_TokenRec  elements[T1_MAX_TABLE_ELEMENTS];
    T1_Token     token;
    FT_Int       num_elements;
    FT_Error     error = FT_Err_Ok;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;
    T1_FieldRec  fieldrec = *(T1_Field)field;


    fieldrec.type = T1_FIELD_TYPE_INTEGER;
    if ( field->type == T1_FIELD_TYPE_FIXED_ARRAY ||
         field->type == T1_FIELD_TYPE_BBOX        )
      fieldrec.type = T1_FIELD_TYPE_FIXED;

    ps_parser_to_token_array( parser, elements,
                              T1_MAX_TABLE_ELEMENTS, &num_elements );
    if ( num_elements < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( (FT_UInt)num_elements > field->array_max )
      num_elements = (FT_Int)field->array_max;

    old_cursor = parser->cursor;
    old_limit  = parser->limit;

    /* we store the elements count if necessary;           */
    /* we further assume that `count_offset' can't be zero */
    if ( field->type != T1_FIELD_TYPE_BBOX && field->count_offset != 0 )
      *(FT_Byte*)( (FT_Byte*)objects[0] + field->count_offset ) =
        (FT_Byte)num_elements;

    /* we now load each element, adjusting the field.offset on each one */
    token = elements;
    for ( ; num_elements > 0; num_elements--, token++ )
    {
      parser->cursor = token->start;
      parser->limit  = token->limit;

      error = ps_parser_load_field( parser,
                                    &fieldrec,
                                    objects,
                                    max_objects,
                                    0 );
      if ( error )
        break;

      fieldrec.offset += fieldrec.size;
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    parser->cursor = old_cursor;
    parser->limit  = old_limit;

  Exit:
    return error;
  }